

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O0

bool __thiscall setup::version::is_ambiguous(version *this)

{
  version *this_local;
  bool local_1;
  
  if (this->value == 0x1031500) {
    local_1 = true;
  }
  else if (this->value == 0x2000100) {
    local_1 = true;
  }
  else if (this->value == 0x3000300) {
    local_1 = true;
  }
  else if (this->value == 0x4020300) {
    local_1 = true;
  }
  else if (this->value == 0x5030a00) {
    local_1 = true;
  }
  else if (this->value == 0x5040200) {
    local_1 = true;
  }
  else if (this->value == 0x5050000) {
    local_1 = true;
  }
  else if ((this->value == 0x5050700) || (this->value == 0x5050701)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool version::is_ambiguous() const {
	
	if(value == INNO_VERSION(1, 3, 21)) {
		// might be either 1.3.21 or 1.3.24
		return true;
	}
	
	if(value == INNO_VERSION(2, 0, 1)) {
		// might be either 2.0.1 or 2.0.2
		return true;
	}
	
	if(value == INNO_VERSION(3, 0, 3)) {
		// might be either 3.0.3 or 3.0.4
		return true;
	}
	
	if(value == INNO_VERSION(4, 2, 3)) {
		// might be either 4.2.3 or 4.2.4
		return true;
	}
	
	if(value == INNO_VERSION(5, 3, 10)) {
		// might be either 5.3.10 or 5.3.10.1
		return true;
	}
	
	if(value == INNO_VERSION(5, 4, 2)) {
		// might be either 5.4.2 or 5.4.2.1
		return true;
	}
	
	if(value == INNO_VERSION(5, 5, 0)) {
		// might be either 5.5.0 or 5.5.0.1
		return true;
	}
	
	if(value == INNO_VERSION(5, 5, 7) || value == INNO_VERSION_EXT(5, 5, 7, 1)) {
		// might be either 5.5.7, an unknown modification of 5.5.7, or 5.6.0
		return true;
	}
	
	return false;
}